

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_interface.c
# Opt level: O1

int EVdfg_unlink_dest(EVdfg_stone source,EVdfg_stone destination)

{
  CManager cm;
  int iVar1;
  
  cm = destination->dfg->master->cm;
  IntCManager_lock(cm,
                   "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                   ,0x4b5);
  iVar1 = INT_EVdfg_unlink_dest(source,destination);
  IntCManager_unlock(cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/build_O1/thirdparty/EVPath/EVPath/cm_interface.c"
                     ,0x4b7);
  return iVar1;
}

Assistant:

extern int
EVdfg_unlink_dest ( EVdfg_stone source, EVdfg_stone destination )
{
	int ret;
	CManager cm = destination->dfg->master->cm;
	CManager_lock(cm);
	ret = INT_EVdfg_unlink_dest(source, destination);
	CManager_unlock(cm);
	return ret;
}